

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

void opj_t1_dec_refpass_step_mqc
               (opj_t1_t *t1,opj_flag_t *flagsp,OPJ_INT32 *datap,OPJ_INT32 poshalf,OPJ_INT32 neghalf
               )

{
  opj_mqc_t *mqc_00;
  OPJ_UINT32 OVar1;
  OPJ_INT32 OVar2;
  int local_50;
  int local_4c;
  opj_mqc_t *mqc;
  OPJ_INT32 flag;
  OPJ_INT32 t;
  OPJ_INT32 v;
  OPJ_INT32 neghalf_local;
  OPJ_INT32 poshalf_local;
  OPJ_INT32 *datap_local;
  opj_flag_t *flagsp_local;
  opj_t1_t *t1_local;
  
  mqc_00 = t1->mqc;
  if (((int)*flagsp & 0x5000U) == 0x1000) {
    OVar1 = opj_t1_getctxno_mag((int)*flagsp);
    mqc_00->curctx = mqc_00->ctxs + OVar1;
    OVar2 = opj_mqc_decode(mqc_00);
    local_4c = neghalf;
    if (OVar2 != 0) {
      local_4c = poshalf;
    }
    if (*datap < 0) {
      local_50 = -local_4c;
    }
    else {
      local_50 = local_4c;
    }
    *datap = local_50 + *datap;
    *flagsp = *flagsp | 0x2000;
  }
  return;
}

Assistant:

static INLINE void opj_t1_dec_refpass_step_mqc(
                opj_t1_t *t1,
                opj_flag_t *flagsp,
                OPJ_INT32 *datap,
                OPJ_INT32 poshalf,
                OPJ_INT32 neghalf)
{
        OPJ_INT32 v, t, flag;
       
        opj_mqc_t *mqc = t1->mqc;       /* MQC component */
       
        flag = *flagsp;
        if ((flag & (T1_SIG | T1_VISIT)) == T1_SIG) {
                opj_mqc_setcurctx(mqc, opj_t1_getctxno_mag((OPJ_UINT32)flag));      /* ESSAI */
                        v = opj_mqc_decode(mqc);
                t = v ? poshalf : neghalf;
                *datap += *datap < 0 ? -t : t;
                *flagsp |= T1_REFINE;
                }
}